

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdAddConfidentialTxIn
              (void *handle,char *tx_hex_string,char *txid,uint32_t vout,uint32_t sequence,
              char **tx_string)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  allocator local_221;
  string local_220;
  ConfidentialTransactionController ctxc;
  string local_1b0;
  ConfidentialTxInReference local_190;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar1) {
    ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController =
         (_func_int **)0x4fbb12;
    ctxc.super_AbstractTransactionController.tx_address_._0_4_ = 0xcc;
    ctxc.transaction_.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)anon_var_dwarf_76e1ab;
    cfd::core::logger::warn<>((CfdSourceLocation *)&ctxc,"tx is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&ctxc,"Failed to parameter. tx is null or empty.",(allocator *)&local_220);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&ctxc);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(txid);
  if (!bVar1) {
    if (tx_string != (char **)0x0) {
      std::__cxx11::string::string((string *)&local_220,tx_hex_string,(allocator *)&local_1b0);
      cfd::ConfidentialTransactionController::ConfidentialTransactionController(&ctxc,&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::string((string *)&local_1b0,txid,&local_221);
      cfd::core::Txid::Txid((Txid *)&local_220,&local_1b0);
      cfd::ConfidentialTransactionController::AddTxIn
                (&local_190,&ctxc,(Txid *)&local_220,vout,sequence);
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_190);
      cfd::core::Txid::~Txid((Txid *)&local_220);
      std::__cxx11::string::~string((string *)&local_1b0);
      cfd::AbstractTransactionController::GetHex_abi_cxx11_
                (&local_220,&ctxc.super_AbstractTransactionController);
      pcVar2 = cfd::capi::CreateString(&local_220);
      *tx_string = pcVar2;
      std::__cxx11::string::~string((string *)&local_220);
      cfd::ConfidentialTransactionController::~ConfidentialTransactionController(&ctxc);
      return 0;
    }
    ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController =
         (_func_int **)0x4fbb12;
    ctxc.super_AbstractTransactionController.tx_address_._0_4_ = 0xd8;
    ctxc.transaction_.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)anon_var_dwarf_76e1ab;
    cfd::core::logger::warn<>((CfdSourceLocation *)&ctxc,"tx output is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&ctxc,"Failed to parameter. tx output is null.",(allocator *)&local_220);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&ctxc);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)0x4fbb12;
  ctxc.super_AbstractTransactionController.tx_address_._0_4_ = 0xd2;
  ctxc.transaction_.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)anon_var_dwarf_76e1ab;
  cfd::core::logger::warn<>((CfdSourceLocation *)&ctxc,"txid is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&ctxc,"Failed to parameter. txid is null or empty.",(allocator *)&local_220);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&ctxc);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddConfidentialTxIn(
    void* handle, const char* tx_hex_string, const char* txid, uint32_t vout,
    uint32_t sequence, char** tx_string) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }

    ConfidentialTransactionController ctxc(tx_hex_string);
    ctxc.AddTxIn(Txid(txid), vout, sequence);
    *tx_string = CreateString(ctxc.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}